

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

bool __thiscall
moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
try_dequeue<unsigned_int>
          (ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *this,uint *item)

{
  __int_type_conflict _Var1;
  __int_type_conflict _Var2;
  ConcurrentQueueProducerTypelessBase *pCVar3;
  ExplicitProducer *pEVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ExplicitProducer *this_00;
  ExplicitProducer *pEVar9;
  bool bVar10;
  
  pEVar4 = (ExplicitProducer *)(this->producerListTail)._M_b._M_p;
  if (pEVar4 == (ExplicitProducer *)0x0) {
    bVar10 = true;
    this_00 = (ExplicitProducer *)0x0;
  }
  else {
    this_00 = (ExplicitProducer *)0x0;
    uVar7 = 0;
    uVar5 = 0;
    do {
      _Var1 = (pEVar4->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
      _Var2 = (pEVar4->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i;
      uVar8 = _Var1 - _Var2;
      if (_Var2 - _Var1 < 0x8000000000000001) {
        uVar8 = 0;
      }
      pEVar9 = this_00;
      uVar6 = uVar5;
      if (uVar5 < uVar8) {
        pEVar9 = pEVar4;
        uVar6 = uVar8;
      }
      if (uVar8 == 0) {
        uVar6 = uVar5;
        pEVar9 = this_00;
      }
      this_00 = pEVar9;
      uVar7 = (uVar8 != 0) + uVar7;
      pCVar3 = (pEVar4->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.next;
      pEVar4 = (ExplicitProducer *)&pCVar3[-1].token;
      if (pCVar3 == (ConcurrentQueueProducerTypelessBase *)0x0) {
        pEVar4 = (ExplicitProducer *)0x0;
      }
    } while ((uVar7 < 3) && (uVar5 = uVar6, pCVar3 != (ConcurrentQueueProducerTypelessBase *)0x0));
    bVar10 = uVar7 == 0;
  }
  if (!bVar10) {
    if ((this_00->super_ProducerBase).isExplicit == true) {
      bVar10 = ExplicitProducer::dequeue<unsigned_int>(this_00,item);
    }
    else {
      bVar10 = ImplicitProducer::dequeue<unsigned_int>((ImplicitProducer *)this_00,item);
    }
    if (bVar10 != false) {
      return true;
    }
    pEVar4 = (ExplicitProducer *)(this->producerListTail)._M_b._M_p;
    pEVar9 = pEVar4;
    while (pEVar9 != (ExplicitProducer *)0x0) {
      if (pEVar4 != this_00) {
        if ((pEVar4->super_ProducerBase).isExplicit == true) {
          bVar10 = ExplicitProducer::dequeue<unsigned_int>(pEVar4,item);
        }
        else {
          bVar10 = ImplicitProducer::dequeue<unsigned_int>((ImplicitProducer *)pEVar4,item);
        }
        if (bVar10 != false) {
          return true;
        }
      }
      pEVar9 = (ExplicitProducer *)
               (pEVar4->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.next;
      pEVar4 = (ExplicitProducer *)&pEVar9[-1].pr_blockIndexRaw;
    }
  }
  return false;
}

Assistant:

bool try_dequeue(U& item)
	{
		// Instead of simply trying each producer in turn (which could cause needless contention on the first
		// producer), we score them heuristically.
		size_t nonEmptyCount = 0;
		ProducerBase* best = nullptr;
		size_t bestSize = 0;
		for (auto ptr = producerListTail.load(std::memory_order_acquire); nonEmptyCount < 3 && ptr != nullptr; ptr = ptr->next_prod()) {
			auto size = ptr->size_approx();
			if (size > 0) {
				if (size > bestSize) {
					bestSize = size;
					best = ptr;
				}
				++nonEmptyCount;
			}
		}
		
		// If there was at least one non-empty queue but it appears empty at the time
		// we try to dequeue from it, we need to make sure every queue's been tried
		if (nonEmptyCount > 0) {
			if (details::likely(best->dequeue(item))) {
				return true;
			}
			for (auto ptr = producerListTail.load(std::memory_order_acquire); ptr != nullptr; ptr = ptr->next_prod()) {
				if (ptr != best && ptr->dequeue(item)) {
					return true;
				}
			}
		}
		return false;
	}